

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_type_enum_value_pos
                 (lysp_ctx *ctx,lysp_stmt *stmt,int64_t *value,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  int64_t iVar1;
  uint uVar2;
  LY_ERR LVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  ly_stmt insubstmt;
  ly_ctx *local_128;
  ly_ctx *local_108;
  ly_ctx *local_e8;
  ly_ctx *local_c8;
  ly_ctx *local_a8;
  ly_ctx *local_88;
  ly_ctx *local_78;
  lysp_stmt *plStack_68;
  LY_ERR ret___1;
  lysp_stmt *child;
  ulonglong uStack_58;
  LY_ERR ret__;
  unsigned_long_long unum;
  longlong num;
  char *ptr;
  lysp_ext_instance **pplStack_38;
  int arg_len;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  int64_t *value_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  num = 0;
  unum = 0;
  uStack_58 = 0;
  pplStack_38 = exts;
  exts_local = (lysp_ext_instance **)flags;
  flags_local = (uint16_t *)value;
  value_local = (int64_t *)stmt;
  stmt_local = (lysp_stmt *)ctx;
  if ((*flags & 0x200) != 0) {
    if (ctx == (lysp_ctx *)0x0) {
      local_78 = (ly_ctx *)0x0;
    }
    else {
      local_78 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar5 = lyplg_ext_stmt2str(stmt->kw);
    ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar5);
    return LY_EVALID;
  }
  *flags = *flags | 0x200;
  LVar3 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    sVar6 = strlen((char *)value_local[1]);
    ptr._4_4_ = (uint)sVar6;
    if ((((ptr._4_4_ == 0) || (*(char *)value_local[1] == '+')) ||
        ((*(char *)value_local[1] == '0' && (1 < (int)ptr._4_4_)))) ||
       ((*(int *)((long)value_local + 0x34) == 0x230000 &&
        (iVar4 = strncmp((char *)value_local[1],"-0",2), iVar4 == 0)))) {
      uVar2 = ptr._4_4_;
      if (stmt_local == (lysp_stmt *)0x0) {
        local_88 = (ly_ctx *)0x0;
      }
      else {
        local_88 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(stmt_local[1].stmt + 8) +
                      (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
      }
      iVar1 = value_local[1];
      pcVar5 = lyplg_ext_stmt2str(*(ly_stmt *)((long)value_local + 0x34));
      ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",(ulong)uVar2
              ,iVar1,pcVar5);
    }
    else {
      piVar7 = __errno_location();
      *piVar7 = 0;
      if (*(int *)((long)value_local + 0x34) == 0x320000) {
        unum = strtoll((char *)value_local[1],(char **)&num,10);
        uVar2 = ptr._4_4_;
        if (((long)unum < -0x80000000) || (0x7fffffff < (long)unum)) {
          if (stmt_local == (lysp_stmt *)0x0) {
            local_a8 = (ly_ctx *)0x0;
          }
          else {
            local_a8 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(stmt_local[1].stmt + 8) +
                          (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
          }
          iVar1 = value_local[1];
          pcVar5 = lyplg_ext_stmt2str(*(ly_stmt *)((long)value_local + 0x34));
          ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  (ulong)uVar2,iVar1,pcVar5);
          return LY_EVALID;
        }
      }
      else {
        uStack_58 = strtoull((char *)value_local[1],(char **)&num,10);
        uVar2 = ptr._4_4_;
        if (0xffffffff < uStack_58) {
          if (stmt_local == (lysp_stmt *)0x0) {
            local_c8 = (ly_ctx *)0x0;
          }
          else {
            local_c8 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(stmt_local[1].stmt + 8) +
                          (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
          }
          iVar1 = value_local[1];
          pcVar5 = lyplg_ext_stmt2str(*(ly_stmt *)((long)value_local + 0x34));
          ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  (ulong)uVar2,iVar1,pcVar5);
          return LY_EVALID;
        }
      }
      uVar2 = ptr._4_4_;
      if (num - value_local[1] == (long)(int)ptr._4_4_) {
        piVar7 = __errno_location();
        uVar2 = ptr._4_4_;
        if (*piVar7 != 0x22) {
          if (*(int *)((long)value_local + 0x34) == 0x320000) {
            *(unsigned_long_long *)flags_local = unum;
          }
          else {
            *(ulonglong *)flags_local = uStack_58;
          }
          plStack_68 = (lysp_stmt *)value_local[5];
          while( true ) {
            if (plStack_68 == (lysp_stmt *)0x0) {
              return LY_SUCCESS;
            }
            if (plStack_68->kw != LY_STMT_EXTENSION_INSTANCE) break;
            insubstmt = LY_STMT_POSITION;
            if (*(int *)((long)value_local + 0x34) == 0x320000) {
              insubstmt = LY_STMT_VALUE;
            }
            LVar3 = lysp_stmt_ext((lysp_ctx *)stmt_local,plStack_68,insubstmt,0,pplStack_38);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            plStack_68 = plStack_68->next;
          }
          if (stmt_local == (lysp_stmt *)0x0) {
            local_128 = (ly_ctx *)0x0;
          }
          else {
            local_128 = *(ly_ctx **)
                         **(undefined8 **)
                           (*(long *)(stmt_local[1].stmt + 8) +
                           (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
          }
          pcVar5 = lyplg_ext_stmt2str(plStack_68->kw);
          pcVar8 = lyplg_ext_stmt2str(*(ly_stmt *)((long)value_local + 0x34));
          ly_vlog(local_128,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,pcVar8);
          return LY_EVALID;
        }
        if (stmt_local == (lysp_stmt *)0x0) {
          local_108 = (ly_ctx *)0x0;
        }
        else {
          local_108 = *(ly_ctx **)
                       **(undefined8 **)
                         (*(long *)(stmt_local[1].stmt + 8) +
                         (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
        }
        iVar1 = value_local[1];
        pcVar5 = lyplg_ext_stmt2str(*(ly_stmt *)((long)value_local + 0x34));
        ly_vlog(local_108,(char *)0x0,LYVE_SYNTAX_YANG,"Value \"%.*s\" is out of \"%s\" bounds.",
                (ulong)uVar2,iVar1,pcVar5);
      }
      else {
        if (stmt_local == (lysp_stmt *)0x0) {
          local_e8 = (ly_ctx *)0x0;
        }
        else {
          local_e8 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(stmt_local[1].stmt + 8) +
                        (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
        }
        iVar1 = value_local[1];
        pcVar5 = lyplg_ext_stmt2str(*(ly_stmt *)((long)value_local + 0x34));
        ly_vlog(local_e8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                (ulong)uVar2,iVar1,pcVar5);
      }
    }
    return LY_EVALID;
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_type_enum_value_pos(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, int64_t *value, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;
    char *ptr = NULL;
    long long num = 0;
    unsigned long long unum = 0;

    if (*flags & LYS_SET_VALUE) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(stmt->kw));
        return LY_EVALID;
    }
    *flags |= LYS_SET_VALUE;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    arg_len = strlen(stmt->arg);
    if (!arg_len || (stmt->arg[0] == '+') || ((stmt->arg[0] == '0') && (arg_len > 1)) ||
            ((stmt->kw == LY_STMT_POSITION) && !strncmp(stmt->arg, "-0", 2))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }

    errno = 0;
    if (stmt->kw == LY_STMT_VALUE) {
        num = strtoll(stmt->arg, &ptr, LY_BASE_DEC);
        if ((num < INT64_C(-2147483648)) || (num > INT64_C(2147483647))) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
            goto error;
        }
    } else {
        unum = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
        if (unum > UINT64_C(4294967295)) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
            goto error;
        }
    }
    /* we have not parsed the whole argument */
    if (ptr - stmt->arg != arg_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }
    if (errno == ERANGE) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }
    if (stmt->kw == LY_STMT_VALUE) {
        *value = num;
    } else {
        *value = unum;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw == LY_STMT_VALUE ? LY_STMT_VALUE : LY_STMT_POSITION, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;

error:
    return LY_EVALID;
}